

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_>::appendInitialize
          (QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_> *this,qsizetype newSize)

{
  pair<QListWidgetItem_*,_int> *ppVar1;
  QListWidgetItem *in_RSI;
  pair<QListWidgetItem_*,_int> *in_RDI;
  pair<QListWidgetItem_*,_int> *e;
  pair<QListWidgetItem_*,_int> *b;
  
  begin((QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_> *)0x8a6620);
  ppVar1 = begin((QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_> *)0x8a6639);
  std::uninitialized_value_construct<std::pair<QListWidgetItem*,int>*>(ppVar1 + (long)in_RSI,in_RDI)
  ;
  in_RDI[1].first = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }